

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::run(Session *this)

{
  type tVar1;
  long in_RDI;
  exception *ex;
  Option<unsigned_long> listed;
  Runner runner;
  Runner *in_stack_fffffffffffffd40;
  Session *in_stack_fffffffffffffd50;
  Ptr<Catch::Config> *in_stack_fffffffffffffd68;
  int iVar2;
  Runner *in_stack_fffffffffffffd70;
  Option<unsigned_long> local_270 [7];
  Config *in_stack_fffffffffffffe08;
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x7e) & 1) == 0) {
    config(in_stack_fffffffffffffd50);
    Runner::Runner(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    iVar2 = (int)in_stack_fffffffffffffd70;
    config(in_stack_fffffffffffffd50);
    list(in_stack_fffffffffffffe08);
    tVar1 = Option::operator_cast_to_function_pointer((Option<unsigned_long> *)0x1bbeb2);
    if (tVar1 != 0) {
      in_stack_fffffffffffffd40 = (Runner *)Option<unsigned_long>::operator*(local_270);
      local_4 = (int)(in_stack_fffffffffffffd40->m_config).m_p;
    }
    Option<unsigned_long>::~Option((Option<unsigned_long> *)0x1bbf4f);
    if (tVar1 == 0) {
      local_4 = iVar2;
      Runner::runTests((Runner *)runner._24_8_);
    }
    Runner::~Runner(in_stack_fffffffffffffd40);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed
                Runner runner( m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runner.runTests().assertions.failed );
            }
            catch( std::exception& ex ) {
                std::cerr << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }